

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O0

void __thiscall Assimp::AMFImporter::Clear(AMFImporter *this)

{
  bool bVar1;
  reference ppCVar2;
  CAMFImporter_NodeElement *ne;
  iterator __end2;
  iterator __begin2;
  list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_> *__range2;
  AMFImporter *this_local;
  
  this->mNodeElement_Cur = (CAMFImporter_NodeElement *)0x0;
  std::__cxx11::string::clear();
  std::__cxx11::
  list<Assimp::AMFImporter::SPP_Material,_std::allocator<Assimp::AMFImporter::SPP_Material>_>::clear
            (&this->mMaterial_Converted);
  std::__cxx11::
  list<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>::clear
            (&this->mTexture_Converted);
  bVar1 = std::__cxx11::
          list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::empty
                    (&this->mNodeElement_List);
  if (!bVar1) {
    __end2 = std::__cxx11::
             list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::begin
                       (&this->mNodeElement_List);
    ne = (CAMFImporter_NodeElement *)
         std::__cxx11::list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
         ::end(&this->mNodeElement_List);
    while( true ) {
      bVar1 = std::operator!=(&__end2,(_Self *)&ne);
      if (!bVar1) break;
      ppCVar2 = std::_List_iterator<CAMFImporter_NodeElement_*>::operator*(&__end2);
      if (*ppCVar2 != (CAMFImporter_NodeElement *)0x0) {
        (*(*ppCVar2)->_vptr_CAMFImporter_NodeElement[1])();
      }
      std::_List_iterator<CAMFImporter_NodeElement_*>::operator++(&__end2);
    }
    std::__cxx11::list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::
    clear(&this->mNodeElement_List);
  }
  return;
}

Assistant:

void AMFImporter::Clear()
{
	mNodeElement_Cur = nullptr;
	mUnit.clear();
	mMaterial_Converted.clear();
	mTexture_Converted.clear();
	// Delete all elements
	if(!mNodeElement_List.empty())
	{
		for(CAMFImporter_NodeElement* ne: mNodeElement_List) { delete ne; }

		mNodeElement_List.clear();
	}
}